

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3Fts3Dequote(char *z)

{
  int local_1c;
  int local_18;
  int iOut;
  int iIn;
  char quote;
  char *z_local;
  
  iOut._3_1_ = *z;
  if ((((iOut._3_1_ == '[') || (iOut._3_1_ == '\'')) || (iOut._3_1_ == '\"')) || (iOut._3_1_ == '`')
     ) {
    local_18 = 1;
    local_1c = 0;
    if (iOut._3_1_ == '[') {
      iOut._3_1_ = ']';
    }
    while (z[local_18] != '\0') {
      if (z[local_18] == iOut._3_1_) {
        if (z[local_18 + 1] != iOut._3_1_) break;
        z[local_1c] = iOut._3_1_;
        local_18 = local_18 + 2;
      }
      else {
        z[local_1c] = z[local_18];
        local_18 = local_18 + 1;
      }
      local_1c = local_1c + 1;
    }
    z[local_1c] = '\0';
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3Fts3Dequote(char *z){
  char quote;                     /* Quote character (if any ) */

  quote = z[0];
  if( quote=='[' || quote=='\'' || quote=='"' || quote=='`' ){
    int iIn = 1;                  /* Index of next byte to read from input */
    int iOut = 0;                 /* Index of next byte to write to output */

    /* If the first byte was a '[', then the close-quote character is a ']' */
    if( quote=='[' ) quote = ']';  

    while( z[iIn] ){
      if( z[iIn]==quote ){
        if( z[iIn+1]!=quote ) break;
        z[iOut++] = quote;
        iIn += 2;
      }else{
        z[iOut++] = z[iIn++];
      }
    }
    z[iOut] = '\0';
  }
}